

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

int nng_dialer_create_url(nng_dialer *dp,nng_socket sid,nng_url *url)

{
  int iVar1;
  uint32_t uVar2;
  nni_sock *local_30;
  nni_sock *s;
  nni_dialer *d;
  
  iVar1 = nni_sock_find(&local_30,sid.id);
  if (iVar1 == 0) {
    iVar1 = nni_dialer_create_url((nni_dialer **)&s,local_30,url);
    if (iVar1 == 0) {
      uVar2 = nni_dialer_id((nni_dialer *)s);
      dp->id = uVar2;
      nni_dialer_rele((nni_dialer *)s);
      iVar1 = 0;
    }
    else {
      nni_sock_rele(local_30);
    }
  }
  return iVar1;
}

Assistant:

int
nng_dialer_create_url(nng_dialer *dp, nng_socket sid, const nng_url *url)
{
	nni_sock   *s;
	nni_dialer *d;
	int         rv;
	nng_dialer  did;

	if ((rv = nni_sock_find(&s, sid.id)) != 0) {
		return (rv);
	}
	if ((rv = nni_dialer_create_url(&d, s, url)) != 0) {
		nni_sock_rele(s);
		return (rv);
	}
	did.id = nni_dialer_id(d);
	*dp    = did;
	nni_dialer_rele(d);
	return (0);
}